

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

TValue * lj_tab_setinth(lua_State *L,GCtab *t,int32_t key)

{
  double dVar1;
  TValue *pTVar2;
  uint uVar3;
  uint uVar5;
  TValue k;
  cTValue local_8;
  uint uVar4;
  
  local_8.n = (lua_Number)key;
  uVar4 = (uint)(local_8.u64 >> 0x1f);
  uVar3 = uVar4 & 0xfffffffe;
  uVar5 = (uVar3 ^ local_8.u32.lo) - (uVar3 << 0xe | uVar4 >> 0x12);
  pTVar2 = (TValue *)
           ((ulong)(((uVar3 << 0x13 | uVar4 >> 0xd) ^ uVar5) - (uVar5 * 0x2000 | uVar5 >> 0x13) &
                   t->hmask) * 0x18 + (t->node).ptr64);
  do {
    dVar1 = pTVar2[1].n;
    if ((ushort)((ulong)dVar1 >> 0x30) < 0xfff9) {
      if ((dVar1 == local_8.n) && (!NAN(dVar1) && !NAN(local_8.n))) {
        return pTVar2;
      }
    }
    pTVar2 = (TValue *)pTVar2[2].u64;
    if (pTVar2 == (TValue *)0x0) {
      pTVar2 = lj_tab_newkey(L,t,&local_8);
      return pTVar2;
    }
  } while( true );
}

Assistant:

TValue *lj_tab_setinth(lua_State *L, GCtab *t, int32_t key)
{
  TValue k;
  Node *n;
  k.n = (lua_Number)key;
  n = hashnum(t, &k);
  do {
    if (tvisnum(&n->key) && n->key.n == k.n)
      return &n->val;
  } while ((n = nextnode(n)));
  return lj_tab_newkey(L, t, &k);
}